

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O0

int64_t __thiscall
libtorrent::aux::stat_cache::get_filesize
          (stat_cache *this,file_index_t i,file_storage *fs,string *save_path,error_code *ec)

{
  undefined3 uVar1;
  error_code *peVar2;
  file_flags_t lhs;
  bool bVar3;
  int iVar4;
  error_category *cat;
  value_type *pvVar5;
  reference pvVar6;
  file_status_flag_t local_d0;
  int local_cc;
  undefined1 local_c8 [8];
  string file_path;
  file_status s;
  long local_78;
  int64_t sz;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_54;
  lock_guard<std::mutex> local_50;
  lock_guard<std::mutex> l;
  bitfield_flag local_39;
  error_code *local_38;
  error_code *ec_local;
  string *save_path_local;
  file_storage *fs_local;
  stat_cache *this_local;
  long lStack_10;
  file_index_t i_local;
  
  local_38 = ec;
  ec_local = (error_code *)save_path;
  save_path_local = (string *)fs;
  fs_local = (file_storage *)this;
  this_local._4_4_ = i.m_val;
  lhs = file_storage::file_flags(fs,i);
  l._M_device._7_1_ = '\b';
  local_39 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)lhs.m_val,
                        (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b');
  bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_39);
  peVar2 = local_38;
  if (bVar3) {
    cat = boost::system::system_category();
    boost::system::error_code::assign(peVar2,2,cat);
    lStack_10 = -1;
  }
  else {
    ::std::lock_guard<std::mutex>::lock_guard(&local_50,&this->m_mutex);
    local_54 = container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>_>
               ::end_index(&this->m_stat_cache);
    bVar3 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                      ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                       ((long)&this_local + 4),&local_54);
    if (bVar3) {
      iVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
      stat_cache_t::stat_cache_t((stat_cache_t *)&sz,-1);
      container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::stat_cache::stat_cache_t,std::allocator<libtorrent::aux::stat_cache::stat_cache_t>>>
      ::resize<int,void>((container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::stat_cache::stat_cache_t,std::allocator<libtorrent::aux::stat_cache::stat_cache_t>>>
                          *)&this->m_stat_cache,iVar4 + 1,(stat_cache_t *)&sz);
    }
    pvVar5 = container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>_>
             ::operator[](&this->m_stat_cache,
                          (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                          this_local._4_4_);
    local_78 = pvVar5->file_size;
    if (local_78 < -1) {
      pvVar6 = ::std::vector<boost::system::error_code,_std::allocator<boost::system::error_code>_>
               ::operator[](&this->m_errors,0xfffffffffffffffe - local_78);
      bVar3 = pvVar6->failed_;
      uVar1 = *(undefined3 *)&pvVar6->field_0x5;
      local_38->val_ = pvVar6->val_;
      local_38->failed_ = bVar3;
      *(undefined3 *)&local_38->field_0x5 = uVar1;
      local_38->cat_ = pvVar6->cat_;
      lStack_10 = -2;
    }
    else {
      if (local_78 == -1) {
        file_status::file_status((file_status *)((long)&file_path.field_2 + 8));
        local_cc = this_local._4_4_;
        file_storage::file_path
                  ((string *)local_c8,(file_storage *)save_path_local,this_local._4_4_,
                   (string *)ec_local);
        peVar2 = local_38;
        libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_status_flag_tag,_void>::
        bitfield_flag(&local_d0);
        stat_file((string *)local_c8,(file_status *)((long)&file_path.field_2 + 8),peVar2,local_d0);
        bVar3 = boost::system::error_code::operator_cast_to_bool(local_38);
        if (bVar3) {
          set_error_impl(this,this_local._4_4_,local_38);
          local_78 = -2;
        }
        else {
          set_cache_impl(this,this_local._4_4_,file_path.field_2._8_8_);
          local_78 = file_path.field_2._8_8_;
        }
        ::std::__cxx11::string::~string((string *)local_c8);
      }
      lStack_10 = local_78;
    }
    ::std::lock_guard<std::mutex>::~lock_guard(&local_50);
  }
  return lStack_10;
}

Assistant:

std::int64_t stat_cache::get_filesize(file_index_t const i, file_storage const& fs
		, std::string const& save_path, error_code& ec)
	{
		// always pretend symlinks don't exist, to trigger special logic for
		// creating and possibly validating them. There's a risk we'll and up in a
		// cycle of references here otherwise.
		// Should stat_file() be changed to use lstat()?
		if (fs.file_flags(i) & file_storage::flag_symlink)
		{
			ec.assign(boost::system::errc::no_such_file_or_directory, boost::system::system_category());
			return -1;
		}

		std::lock_guard<std::mutex> l(m_mutex);
		TORRENT_ASSERT(i < fs.end_file());
		if (i >= m_stat_cache.end_index()) m_stat_cache.resize(static_cast<int>(i) + 1
			, stat_cache_t{not_in_cache});
		std::int64_t sz = m_stat_cache[i].file_size;
		if (sz < not_in_cache)
		{
			ec = m_errors[std::size_t(-sz + file_error)];
			return file_error;
		}
		else if (sz == not_in_cache)
		{
			// query the filesystem
			file_status s;
			std::string const file_path = fs.file_path(i, save_path);
			stat_file(file_path, &s, ec);
			if (ec)
			{
				set_error_impl(i, ec);
				sz = file_error;
			}
			else
			{
				set_cache_impl(i, s.file_size);
				sz = s.file_size;
			}
		}
		return sz;
	}